

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall
TextField::TextField
          (TextField *this,string *labelText,string *initialFieldText,Color *textColor,uint charSize
          ,float x,float y,Color *fillColor,Color *outlineColor,int maxCharacters,bool isEditable)

{
  undefined8 uVar1;
  Font *pFVar2;
  ulong uVar3;
  int *piVar4;
  ulong in_RDX;
  undefined8 *in_RDI;
  uint in_R8D;
  float in_XMM0_Da;
  float fVar5;
  float in_XMM1_Da;
  undefined4 uVar6;
  undefined4 uVar7;
  FloatRect FVar8;
  int in_stack_00000010;
  byte in_stack_00000018;
  string maxSizeField;
  undefined4 in_stack_fffffffffffffd38;
  float in_stack_fffffffffffffd3c;
  Text *in_stack_fffffffffffffd40;
  Text *this_00;
  Vector2f *in_stack_fffffffffffffd48;
  Text *in_stack_fffffffffffffd50;
  Transformable *this_01;
  Text *local_2a8;
  locale *in_stack_fffffffffffffd80;
  Transformable *this_02;
  undefined1 in_stack_fffffffffffffd88 [16];
  undefined1 auVar9 [16];
  undefined1 local_170 [76];
  Vector2f local_124;
  Vector2<float> local_11c;
  float local_114;
  float local_110 [2];
  float local_108;
  float local_100 [2];
  float local_f8 [2];
  Vector2<float> local_f0;
  float local_e8 [2];
  float local_e0 [2];
  locale local_d8 [47];
  allocator local_a9;
  string local_a8 [32];
  locale local_88 [44];
  Vector2<float> local_5c;
  Vector2<float> local_54 [3];
  byte local_39;
  float local_2c;
  float local_28;
  uint local_24;
  ulong local_18;
  
  local_39 = in_stack_00000018 & 1;
  local_2c = in_XMM1_Da;
  local_28 = in_XMM0_Da;
  local_24 = in_R8D;
  local_18 = in_RDX;
  UIComponent::UIComponent((UIComponent *)in_stack_fffffffffffffd50);
  *in_RDI = &PTR__TextField_002bc210;
  in_RDI[1] = &PTR__TextField_002bc248;
  sf::Text::Text(local_2a8);
  sf::Text::Text(local_2a8);
  sf::Vector2<float>::Vector2(local_54,0.0,0.0);
  sf::RectangleShape::RectangleShape
            ((RectangleShape *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  sf::Vector2<float>::Vector2(&local_5c,0.0,0.0);
  sf::RectangleShape::RectangleShape
            ((RectangleShape *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  pFVar2 = Board::getFont();
  sf::Text::setFont((Text *)(in_RDI + 0x17),pFVar2);
  std::locale::locale(local_88);
  sf::String::String(in_stack_fffffffffffffd88._8_8_,in_stack_fffffffffffffd88._0_8_,
                     in_stack_fffffffffffffd80);
  sf::Text::setString(in_stack_fffffffffffffd40,
                      (String *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  sf::String::~String((String *)0x1a8a1d);
  std::locale::~locale(local_88);
  sf::Text::setFillColor(in_stack_fffffffffffffd50,(Color *)in_stack_fffffffffffffd48);
  sf::Text::setCharacterSize((Text *)(in_RDI + 0x17),local_24);
  sf::Transformable::setPosition((Transformable *)(in_RDI + 0x18),0.0,0.0);
  uVar3 = (ulong)in_stack_00000010;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,uVar3,' ',&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pFVar2 = Board::getFont();
  sf::Text::setFont((Text *)(in_RDI + 0x45),pFVar2);
  std::locale::locale(local_d8);
  sf::String::String(in_stack_fffffffffffffd88._8_8_,in_stack_fffffffffffffd88._0_8_,
                     in_stack_fffffffffffffd80);
  sf::Text::setString(in_stack_fffffffffffffd40,
                      (String *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  sf::String::~String((String *)0x1a8b81);
  std::locale::~locale(local_d8);
  sf::Text::setFillColor(in_stack_fffffffffffffd50,(Color *)in_stack_fffffffffffffd48);
  sf::Text::setCharacterSize((Text *)(in_RDI + 0x45),local_24);
  FVar8 = sf::Text::getLocalBounds
                    ((Text *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  local_e8 = FVar8._0_8_;
  local_e0[0] = FVar8.width;
  fVar5 = local_e0[0] + 5.0;
  local_e0 = (float  [2])FVar8._8_8_;
  sf::Transformable::setPosition((Transformable *)(in_RDI + 0x46),fVar5,0.0);
  FVar8 = sf::Text::getLocalBounds
                    ((Text *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  local_100 = FVar8._0_8_;
  local_f8[0] = FVar8.width;
  uVar6 = 0;
  uVar7 = 0;
  fVar5 = local_f8[0] + 10.0;
  local_f8 = (float  [2])FVar8._8_8_;
  sf::Vector2<float>::Vector2(&local_f0,fVar5,(float)local_24 * 1.5);
  sf::RectangleShape::setSize
            ((RectangleShape *)in_stack_fffffffffffffd40,
             (Vector2f *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  sf::Shape::setFillColor
            ((Shape *)in_stack_fffffffffffffd40,
             (Color *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  sf::Shape::setOutlineColor
            ((Shape *)in_stack_fffffffffffffd40,
             (Color *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  sf::Shape::setOutlineThickness((Shape *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
  this_02 = (Transformable *)(in_RDI + 0x74);
  FVar8 = sf::Text::getLocalBounds
                    ((Text *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  uVar1 = FVar8._8_8_;
  auVar9._8_4_ = uVar6;
  auVar9._0_4_ = (float)uVar1;
  auVar9[4] = SUB81(uVar1,4);
  auVar9._5_3_ = SUB83(uVar1,5);
  auVar9._12_4_ = uVar7;
  local_110 = FVar8._0_8_;
  local_108 = FVar8.width;
  fVar5 = local_108;
  _local_108 = uVar1;
  sf::Transformable::setPosition(this_02,fVar5,0.0);
  local_114 = (float)std::__cxx11::string::length();
  piVar4 = std::min<int>(&stack0x00000010,(int *)&local_114);
  *(int *)(in_RDI + 0xc9) = *piVar4;
  sf::Vector2<float>::Vector2(&local_11c,2.0,(float)local_24 * 1.5 + -4.0);
  sf::RectangleShape::setSize
            ((RectangleShape *)in_stack_fffffffffffffd40,
             (Vector2f *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  sf::Shape::setFillColor
            ((Shape *)in_stack_fffffffffffffd40,
             (Color *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  this_01 = (Transformable *)(in_RDI + 0x9f);
  local_124 = sf::Text::findCharacterPos(auVar9._0_8_,(size_t)this_02);
  sf::Transformable::setPosition(this_01,local_124.x,2.0);
  std::__cxx11::string::substr((ulong)(local_170 + 8),local_18);
  this_00 = (Text *)local_170;
  std::locale::locale((locale *)this_00);
  sf::String::String(auVar9._8_8_,auVar9._0_8_,(locale *)this_02);
  sf::Text::setString(this_00,(String *)
                              CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  sf::String::~String((String *)0x1a8f4c);
  std::locale::~locale((locale *)local_170);
  std::__cxx11::string::~string((string *)(local_170 + 8));
  sf::Transformable::setPosition((Transformable *)(in_RDI + 1),local_28,local_2c);
  *(int *)((long)in_RDI + 0x64c) = in_stack_00000010;
  *(undefined1 *)(in_RDI + 0xca) = 0;
  *(byte *)((long)in_RDI + 0x651) = local_39 & 1;
  std::__cxx11::string::~string(local_a8);
  return;
}

Assistant:

TextField::TextField(const string& labelText, const string& initialFieldText, const Color& textColor, unsigned int charSize, float x, float y, const Color& fillColor, const Color& outlineColor, int maxCharacters, bool isEditable) {
    label.setFont(Board::getFont());
    label.setString(labelText);
    label.setFillColor(textColor);
    label.setCharacterSize(charSize);
    label.setPosition(0.0f, 0.0f);
    
    string maxSizeField(maxCharacters, ' ');
    field.setFont(Board::getFont());
    field.setString(maxSizeField);
    field.setFillColor(textColor);
    field.setCharacterSize(charSize);
    field.setPosition(label.getLocalBounds().width + 5.0f, 0.0f);
    
    background.setSize(Vector2f(field.getLocalBounds().width + 10.0f, charSize * 1.5f));
    background.setFillColor(fillColor);
    background.setOutlineColor(outlineColor);
    background.setOutlineThickness(-2.0f);
    background.setPosition(label.getLocalBounds().width, 0.0f);
    
    caretPosition = min(maxCharacters, static_cast<int>(initialFieldText.length()));
    caret.setSize(Vector2f(2.0f, charSize * 1.5f - 4.0f));
    caret.setFillColor(textColor);
    caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
    field.setString(initialFieldText.substr(0, maxCharacters));
    
    setPosition(x, y);
    this->maxCharacters = maxCharacters;
    selected = false;
    this->isEditable = isEditable;
}